

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::MaybeScheduleCompaction(DBImpl *this)

{
  long *plVar1;
  bool bVar2;
  Mutex *in_RDI;
  long in_FS_OFFSET;
  atomic<bool> *unaff_retaddr;
  VersionSet *this_00;
  
  this_00 = *(VersionSet **)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld(in_RDI);
  if (((((in_RDI[0xd].mu_.super___mutex_base._M_mutex.__size[0x10] & 1U) == 0) &&
       (bVar2 = std::atomic<bool>::load(unaff_retaddr,(memory_order)((ulong)this_00 >> 0x20)),
       !bVar2)) && (bVar2 = Status::ok((Status *)in_RDI), bVar2)) &&
     (((in_RDI[7].mu_.super___mutex_base._M_mutex.__data.__list.__next !=
        (__pthread_internal_list *)0x0 ||
       (in_RDI[0xd].mu_.super___mutex_base._M_mutex.__data.__list.__prev !=
        (__pthread_internal_list *)0x0)) || (bVar2 = VersionSet::NeedsCompaction(this_00), bVar2))))
  {
    in_RDI[0xd].mu_.super___mutex_base._M_mutex.__size[0x10] = '\x01';
    plVar1 = *(long **)((long)&(in_RDI->mu_).super___mutex_base._M_mutex + 8);
    (**(code **)(*plVar1 + 0x78))(plVar1,BGWork);
  }
  if (*(VersionSet **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::MaybeScheduleCompaction() {
  mutex_.AssertHeld();
  if (background_compaction_scheduled_) {
    // Already scheduled
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // DB is being deleted; no more background compactions
  } else if (!bg_error_.ok()) {
    // Already got an error; no more changes
  } else if (imm_ == nullptr && manual_compaction_ == nullptr &&
             !versions_->NeedsCompaction()) {
    // No work to be done
  } else {
    background_compaction_scheduled_ = true;
    env_->Schedule(&DBImpl::BGWork, this);
  }
}